

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentedMap.hpp
# Opt level: O0

void __thiscall
binlog::detail::SegmentedMap<binlog::EventSource>::emplace<binlog::EventSource>
          (SegmentedMap<binlog::EventSource> *this,key_type key,EventSource *args)

{
  initializer_list<binlog::EventSource> __l;
  reference pvVar1;
  size_type sVar2;
  long in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  difference_type ito;
  Segment *segment;
  key_type vi;
  key_type offset;
  key_type si;
  EventSource *in_stack_fffffffffffffd78;
  EventSource *in_stack_fffffffffffffd80;
  const_iterator in_stack_fffffffffffffd88;
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *in_stack_fffffffffffffd90;
  iterator *ppEVar3;
  key_type in_stack_fffffffffffffd98;
  iterator *ppEVar4;
  SegmentedMap<binlog::EventSource> *in_stack_fffffffffffffda0;
  allocator_type *in_stack_fffffffffffffda8;
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *this_00;
  iterator pEVar5;
  undefined1 *puVar6;
  undefined1 local_211;
  iterator local_210 [3];
  value_type_conflict7 *in_stack_fffffffffffffe08;
  undefined8 in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  iterator local_158;
  undefined8 local_150;
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *local_130;
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *local_128;
  unsigned_long *local_118;
  unsigned_long *local_110;
  unsigned_long *local_108;
  long local_f8;
  vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *local_38;
  size_type local_30;
  value_type local_28;
  size_type local_20;
  long local_10;
  
  local_10 = in_RSI;
  local_20 = segmentIndex(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RDI,local_20);
  local_28 = *pvVar1;
  local_30 = local_10 - local_28;
  local_38 = std::
             vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
             ::operator[]((vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
                           *)(in_RDI + 1),local_20);
  sVar2 = std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::size(local_38);
  if (sVar2 == local_30) {
    std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::
    emplace_back<binlog::EventSource>
              (in_stack_fffffffffffffd90,(EventSource *)in_stack_fffffffffffffd88._M_current);
  }
  else {
    sVar2 = std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::size(local_38);
    if (local_30 < sVar2) {
      EventSource::EventSource(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::operator[]
                (local_38,local_30);
      EventSource::operator=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      EventSource::~EventSource(in_stack_fffffffffffffd80);
    }
    else {
      local_f8 = local_20 + 1;
      local_110 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffd78);
      local_108 = (unsigned_long *)
                  __gnu_cxx::
                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffd88._M_current,
                              (difference_type)in_stack_fffffffffffffd80);
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffd80,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffd78);
      local_118 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::insert
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffe10,(const_iterator)in_stack_fffffffffffffe18,
                             in_stack_fffffffffffffe08);
      this_00 = (vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *)(in_RDI + 1);
      local_130 = (vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *)
                  std::
                  vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
                  ::begin((vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
                           *)in_stack_fffffffffffffd78);
      local_128 = (vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *)
                  __gnu_cxx::
                  __normal_iterator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_*,_std::vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>_>
                  ::operator+((__normal_iterator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_*,_std::vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>_>
                               *)in_stack_fffffffffffffd88._M_current,
                              (difference_type)in_stack_fffffffffffffd80);
      __gnu_cxx::
      __normal_iterator<std::vector<binlog::EventSource,std::allocator<binlog::EventSource>>const*,std::vector<std::vector<binlog::EventSource,std::allocator<binlog::EventSource>>,std::allocator<std::vector<binlog::EventSource,std::allocator<binlog::EventSource>>>>>
      ::__normal_iterator<std::vector<binlog::EventSource,std::allocator<binlog::EventSource>>*>
                ((__normal_iterator<const_std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_*,_std::vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>_>
                  *)in_stack_fffffffffffffd80,
                 (__normal_iterator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_*,_std::vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>_>
                  *)in_stack_fffffffffffffd78);
      pEVar5 = (iterator)local_210;
      EventSource::EventSource(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      local_150 = 1;
      puVar6 = &local_211;
      local_158 = pEVar5;
      std::allocator<binlog::EventSource>::allocator((allocator<binlog::EventSource> *)0x26f97d);
      __l._M_len = (size_type)puVar6;
      __l._M_array = pEVar5;
      std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::vector
                (this_00,__l,in_stack_fffffffffffffda8);
      std::
      vector<std::vector<binlog::EventSource,std::allocator<binlog::EventSource>>,std::allocator<std::vector<binlog::EventSource,std::allocator<binlog::EventSource>>>>
      ::emplace<std::vector<binlog::EventSource,std::allocator<binlog::EventSource>>>
                ((vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
                  *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd88,
                 (vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *)
                 in_stack_fffffffffffffd78);
      std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::~vector
                (in_stack_fffffffffffffd90);
      std::allocator<binlog::EventSource>::~allocator((allocator<binlog::EventSource> *)0x26f9e3);
      ppEVar4 = local_210;
      ppEVar3 = &local_158;
      do {
        ppEVar3 = ppEVar3 + -0x17;
        EventSource::~EventSource(in_stack_fffffffffffffd80);
      } while (ppEVar3 != ppEVar4);
    }
  }
  return;
}

Assistant:

void emplace(const key_type key, Args&&... args)
  {
    const key_type si = segmentIndex(key);
    const key_type offset = _offsets[si];
    const key_type vi = key - offset;
    Segment& segment = _segments[si];

    if (segment.size() == vi)
    {
      segment.emplace_back(std::forward<Args>(args)...);
    }
    else if (segment.size() > vi)
    {
      segment[vi] = mapped_type(std::forward<Args>(args)...);
    }
    else
    {
      const auto ito = std::vector<key_type>::iterator::difference_type(si + 1);
      _offsets.insert(_offsets.begin() + ito, key);
      _segments.emplace(_segments.begin() + ito, Segment{mapped_type(std::forward<Args>(args)...)});
    }
  }